

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char **ppcVar1;
  int iVar2;
  int iVar3;
  GLFWwindow *handle;
  size_t __size;
  char *pcVar4;
  EVP_PKEY_CTX *ctx;
  long lVar5;
  char **__args;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int local_50;
  
  local_50 = 1;
  if (1 < argc) {
    local_50 = 1;
    iVar6 = 1;
    do {
      lVar5 = (long)iVar6;
      pcVar4 = argv[lVar5];
      iVar3 = strcmp("--merl",pcVar4);
      if (iVar3 == 0) {
        std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)&g_sphere.shading,0);
        iVar3 = iVar6 + 2;
        if (iVar6 + 2 < argc) {
          iVar3 = argc;
        }
        __args = argv + lVar5 + 1;
        lVar5 = lVar5 + 2;
        do {
          if (g_sphere.shading.merl.files.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              g_sphere.shading.merl.files.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char_const*,std::allocator<char_const*>>::
            _M_realloc_insert<char_const*const&>
                      ((vector<char_const*,std::allocator<char_const*>> *)&g_sphere.shading,
                       (iterator)
                       g_sphere.shading.merl.files.
                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,__args);
          }
          else {
            *g_sphere.shading.merl.files.
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish = *__args;
            g_sphere.shading.merl.files.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 g_sphere.shading.merl.files.
                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          iVar2 = iVar3 + -1;
          if ((long)(ulong)(uint)argc <= lVar5) break;
          ppcVar1 = __args + 1;
          __args = __args + 1;
          lVar5 = lVar5 + 1;
          iVar6 = iVar6 + 1;
          iVar2 = iVar6;
        } while (**ppcVar1 != '-');
        iVar6 = iVar2;
        fprintf(_stdout,"Note: number of MERL BRDFs set to %i\n",
                (ulong)((long)g_sphere.shading.merl.files.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)g_sphere.shading.merl.files.
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3);
        goto LAB_0014b226;
      }
      iVar3 = strcmp("--output-dir",pcVar4);
      if (iVar3 == 0) {
        g_app.dir.output = argv[lVar5 + 1];
        pcVar4 = "Note: output directory set to %s\n";
LAB_0014b1dd:
        iVar6 = iVar6 + 1;
        fprintf(_stdout,pcVar4);
LAB_0014b226:
        fflush(_stdout);
      }
      else {
        iVar3 = strcmp("--shader-dir",pcVar4);
        if (iVar3 == 0) {
          g_app.dir.shader = argv[lVar5 + 1];
          pcVar4 = "Note: shader directory set to %s\n";
          goto LAB_0014b1dd;
        }
        iVar3 = strcmp("--record",pcVar4);
        if (iVar3 == 0) {
          g_app.recorder.on = 1;
          __size = 0x18;
          pcVar4 = "Note: recording enabled\n";
LAB_0014b221:
          fwrite(pcVar4,__size,1,_stdout);
          goto LAB_0014b226;
        }
        iVar3 = strcmp("--no-hud",pcVar4);
        if (iVar3 == 0) {
          g_app.viewer.hud = false;
          __size = 0x1d;
          pcVar4 = "Note: HUD rendering disabled\n";
          goto LAB_0014b221;
        }
        iVar3 = strcmp("--hidden",pcVar4);
        if (iVar3 == 0) {
          fwrite("Note: viewer will run hidden\n",0x1d,1,_stdout);
          local_50 = 0;
          goto LAB_0014b226;
        }
        iVar3 = strcmp("--frame-limit",pcVar4);
        if (iVar3 == 0) {
          iVar6 = iVar6 + 1;
          g_app.frameLimit = atoi(argv[lVar5 + 1]);
          fprintf(_stdout,"Note: frame limit set to %i\n",(ulong)(uint)g_app.frameLimit);
          goto LAB_0014b226;
        }
        iVar3 = strcmp("--cmap",pcVar4);
        if (iVar3 == 0) {
          g_sphere.shading.pathToCmap = argv[lVar5 + 1];
          pcVar4 = "Note: cmap set to: %s\n";
          goto LAB_0014b1dd;
        }
        iVar3 = strcmp("--dir",pcVar4);
        if (iVar3 == 0) {
          dVar7 = atof(argv[lVar5 + 1]);
          iVar6 = iVar6 + 2;
          g_sphere.brdf.thetaI = (float)dVar7;
          dVar8 = atof(argv[lVar5 + 2]);
          g_sphere.brdf.phiI = (float)dVar8;
          fprintf(_stdout,"Note: wi set to: (%f %f)\n",(double)(float)dVar7,
                  (double)g_sphere.brdf.phiI);
          goto LAB_0014b226;
        }
        iVar3 = strcmp("--alpha",pcVar4);
        if ((iVar3 == 0) || (iVar3 = strcmp("--sc",pcVar4), iVar3 == 0)) {
          iVar6 = iVar6 + 1;
          dVar7 = atof(argv[lVar5 + 1]);
          g_sphere.brdf.ggxAlpha = (float)dVar7;
          fprintf(_stdout,"Note: GGX alpha set to: %f\n",(double)g_sphere.brdf.ggxAlpha);
          goto LAB_0014b226;
        }
        iVar3 = strcmp("--color",pcVar4);
        if (iVar3 == 0) {
          dVar7 = atof(argv[lVar5 + 1]);
          g_sphere.sphere.color.r = (float)dVar7;
          dVar8 = atof(argv[lVar5 + 2]);
          g_sphere.sphere.color.g = (float)dVar8;
          dVar9 = atof(argv[lVar5 + 3]);
          iVar6 = iVar6 + 4;
          g_sphere.sphere.color.b = (float)dVar9;
          dVar10 = atof(argv[lVar5 + 4]);
          g_sphere.sphere.color.a = (float)dVar10;
          fprintf(_stdout,"Note: surface color set to: (%f %f %f %f)\n",(double)(float)dVar7,
                  (double)(float)dVar8,(double)(float)dVar9,(double)g_sphere.sphere.color.a);
          goto LAB_0014b226;
        }
        iVar3 = strcmp("--enable-sphere-lines",pcVar4);
        if (iVar3 == 0) {
          g_sphere.flags.showLines = true;
          __size = 0x2e;
          pcVar4 = "Note: rendering flag sphere-lines set to true\n";
          goto LAB_0014b221;
        }
        iVar3 = strcmp("--disable-sphere-lines",pcVar4);
        if (iVar3 == 0) {
          g_sphere.flags.showLines = false;
          __size = 0x2f;
          pcVar4 = "Note: rendering flag sphere-lines set to false\n";
          goto LAB_0014b221;
        }
        iVar3 = strcmp("--enable-sphere-surface",pcVar4);
        if (iVar3 == 0) {
          g_sphere.flags.showSurface = true;
          __size = 0x30;
          pcVar4 = "Note: rendering flag sphere-surface set to true\n";
          goto LAB_0014b221;
        }
        iVar3 = strcmp("--disable-sphere-surface",pcVar4);
        if (iVar3 == 0) {
          g_sphere.flags.showSurface = false;
          __size = 0x31;
          pcVar4 = "Note: rendering flag sphere-surface set to false\n";
          goto LAB_0014b221;
        }
        iVar3 = strcmp("--enable-sphere-samples",pcVar4);
        if (iVar3 == 0) {
          g_sphere.flags.showSamples = true;
          __size = 0x30;
          pcVar4 = "Note: rendering flag sphere-samples set to true\n";
          goto LAB_0014b221;
        }
        iVar3 = strcmp("--disable-sphere-samples",pcVar4);
        if (iVar3 == 0) {
          g_sphere.flags.showSamples = false;
          __size = 0x31;
          pcVar4 = "Note: rendering flag sphere-samples set to false\n";
          goto LAB_0014b221;
        }
        iVar3 = strcmp("--enable-sphere-wi-helper",pcVar4);
        if (iVar3 == 0) {
          g_sphere.flags.showWiHelper = true;
          __size = 0x32;
          pcVar4 = "Note: rendering flag sphere-wi-helper set to true\n";
          goto LAB_0014b221;
        }
        iVar3 = strcmp("--disable-sphere-wi-helper",pcVar4);
        if (iVar3 == 0) {
          g_sphere.flags.showWiHelper = false;
          __size = 0x33;
          pcVar4 = "Note: rendering flag sphere-wi-helper set to false\n";
          goto LAB_0014b221;
        }
        iVar3 = strcmp("--enable-parametric",pcVar4);
        if (iVar3 == 0) {
          g_sphere.flags.showParametric = true;
          __size = 0x2c;
          pcVar4 = "Note: rendering flag parametric set to true\n";
          goto LAB_0014b221;
        }
        iVar3 = strcmp("--disable-parametric",pcVar4);
        if (iVar3 == 0) {
          g_sphere.flags.showParametric = false;
          __size = 0x2d;
          pcVar4 = "Note: rendering flag parametric set to false\n";
          goto LAB_0014b221;
        }
        iVar3 = strcmp("--shading-color",pcVar4);
        if (iVar3 == 0) {
          g_sphere.shading.mode = 0;
          __size = 0x20;
          pcVar4 = "Note: shading mode set to color\n";
          goto LAB_0014b221;
        }
        iVar3 = strcmp("--shading-cmap",pcVar4);
        if (iVar3 == 0) {
          g_sphere.shading.mode = 1;
          __size = 0x1f;
          pcVar4 = "Note: shading mode set to cmap\n";
          goto LAB_0014b221;
        }
        iVar3 = strcmp("--shading-brdf",pcVar4);
        if (iVar3 == 0) {
          g_sphere.shading.mode = 2;
          __size = 0x1f;
          pcVar4 = "Note: shading mode set to brdf\n";
          goto LAB_0014b221;
        }
        iVar3 = strcmp("--scheme-ggx",pcVar4);
        if (iVar3 == 0) {
          g_sphere.samples.scheme = 1;
          __size = 0x18;
          pcVar4 = "Note: scheme set to ggx\n";
          goto LAB_0014b221;
        }
        iVar3 = strcmp("--scheme-merl",pcVar4);
        if (iVar3 == 0) {
          g_sphere.samples.scheme = 0;
          __size = 0x19;
          pcVar4 = "Note: scheme set to merl\n";
          goto LAB_0014b221;
        }
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < argc);
  }
  glfwInit();
  glfwWindowHint(0x22002,4);
  glfwWindowHint(0x22003,5);
  glfwWindowHint(0x22008,0x32001);
  glfwWindowHint(0x22007,1);
  glfwWindowHint(0x20004,local_50);
  fwrite("Loading {Window-Main}\n",0x16,1,_stdout);
  fflush(_stdout);
  handle = glfwCreateWindow(0x400,0x400,"Hello MERL",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    fwrite("=> Failure <=\n",0xe,1,_stdout);
    fflush(_stdout);
    glfwTerminate();
  }
  else {
    glfwMakeContextCurrent(handle);
    glfwSetKeyCallback(handle,keyboardCallback);
    glfwSetCursorPosCallback(handle,mouseMotionCallback);
    glfwSetMouseButtonCallback(handle,mouseButtonCallback);
    glfwSetScrollCallback(handle,mouseScrollCallback);
    fwrite("Loading {OpenGL}\n",0x11,1,_stdout);
    fflush(_stdout);
    iVar6 = gladLoadGLLoader(glfwGetProcAddress);
    if (iVar6 != 0) {
      (*glad_glEnable)(0x8242);
      (*glad_glDebugMessageCallback)(debug_output_logger,(void *)0x0);
      fwrite("-- Begin -- Demo\n",0x11,1,_stdout);
      fflush(_stdout);
      ImGui::CreateContext((ImFontAtlas *)0x0);
      ImGui_ImplGlfwGL3_Init(handle,false,(char *)0x0);
      ctx = (EVP_PKEY_CTX *)0x0;
      ImGui::StyleColorsDark((ImGuiStyle *)0x0);
      init(ctx);
      while ((iVar6 = glfwWindowShouldClose(handle), iVar6 == 0 &&
             ((uint)g_app.frame < (uint)g_app.frameLimit))) {
        glfwPollEvents();
        render();
        g_app.frame = g_app.frame + 1;
        glfwSwapBuffers(handle);
      }
      release();
      ImGui_ImplGlfwGL3_Shutdown();
      ImGui::DestroyContext((ImGuiContext *)0x0);
      glfwTerminate();
      fwrite("-- End -- Demo\n",0xf,1,_stdout);
      fflush(_stdout);
      return 0;
    }
    fwrite("gladLoadGLLoader failed\n",0x18,1,_stdout);
    fflush(_stdout);
  }
  return -1;
}

Assistant:

int main(int argc, const char **argv)
{
    GLenum startVisible = GL_TRUE;

    #define PARSE_SHADING_MODE(str, enumval)               \
    else if (!strcmp("--shading-" str, argv[i])) {      \
            g_sphere.shading.mode = enumval;              \
            LOG("Note: shading mode set to " str "\n");  \
    }
    #define PARSE_SAMPLING_SCHEME(str, enumval)               \
    else if (!strcmp("--scheme-" str, argv[i])) {      \
            g_sphere.samples.scheme = enumval;              \
            LOG("Note: scheme set to " str "\n");  \
    }
    #define PARSE_SPHERE_FLAG(str, flag)                    \
    else if (!strcmp("--enable-" str, argv[i])) {           \
        flag = true;                                        \
        LOG("Note: rendering flag " str " set to true\n");   \
    } else if  (!strcmp("--disable-" str, argv[i])) {       \
        flag = false;                                       \
        LOG("Note: rendering flag " str " set to false\n");  \
    }

    for (int i = 1; i < argc; ++i) {
        if (!strcmp("--merl", argv[i])) {
            g_sphere.shading.merl.files.resize(0);
            do {
                g_sphere.shading.merl.files.push_back(argv[++i]);
            } while ((i+1 < argc) && strncmp("-", argv[i+1], 1));
            LOG("Note: number of MERL BRDFs set to %i\n", (int)g_sphere.shading.merl.files.size());
        } else if (!strcmp("--output-dir", argv[i])) {
            g_app.dir.output = (const char *)argv[++i];
            LOG("Note: output directory set to %s\n", g_app.dir.output);
        } else if (!strcmp("--shader-dir", argv[i])) {
            g_app.dir.shader = (const char *)argv[++i];
            LOG("Note: shader directory set to %s\n", g_app.dir.shader);
        } else if (!strcmp("--record", argv[i])) {
            g_app.recorder.on = true;
            LOG("Note: recording enabled\n");
        } else if (!strcmp("--no-hud", argv[i])) {
            g_app.viewer.hud = false;
            LOG("Note: HUD rendering disabled\n");
        } else if (!strcmp("--hidden", argv[i])) {
            startVisible = GL_FALSE;
            LOG("Note: viewer will run hidden\n");
        } else if (!strcmp("--frame-limit", argv[i])) {
            g_app.frameLimit = atoi(argv[++i]);
            LOG("Note: frame limit set to %i\n", g_app.frameLimit);
        } else if (!strcmp("--cmap", argv[i])) {
            g_sphere.shading.pathToCmap = argv[++i];
            LOG("Note: cmap set to: %s\n", g_sphere.shading.pathToCmap);
        } else if (!strcmp("--dir", argv[i])) {
            g_sphere.brdf.thetaI = atof(argv[++i]);
            g_sphere.brdf.phiI = atof(argv[++i]);
            LOG("Note: wi set to: (%f %f)\n", g_sphere.brdf.thetaI, g_sphere.brdf.phiI);
        } else if (!strcmp("--alpha", argv[i])) {
            g_sphere.brdf.ggxAlpha = atof(argv[++i]);
            LOG("Note: GGX alpha set to: %f\n", g_sphere.brdf.ggxAlpha);
        }  else if (!strcmp("--sc", argv[i])) {
            g_sphere.brdf.ggxAlpha = atof(argv[++i]);
            LOG("Note: GGX alpha set to: %f\n", g_sphere.brdf.ggxAlpha);
        } else if (!strcmp("--color", argv[i])) {
            g_sphere.sphere.color.r = atof(argv[++i]);
            g_sphere.sphere.color.g = atof(argv[++i]);
            g_sphere.sphere.color.b = atof(argv[++i]);
            g_sphere.sphere.color.a = atof(argv[++i]);
            LOG("Note: surface color set to: (%f %f %f %f)\n",
                g_sphere.sphere.color.r,
                g_sphere.sphere.color.g,
                g_sphere.sphere.color.b,
                g_sphere.sphere.color.a);
        }
        PARSE_SPHERE_FLAG("sphere-lines", g_sphere.flags.showLines)
        PARSE_SPHERE_FLAG("sphere-surface", g_sphere.flags.showSurface)
        PARSE_SPHERE_FLAG("sphere-samples", g_sphere.flags.showSamples)
        PARSE_SPHERE_FLAG("sphere-wi-helper", g_sphere.flags.showWiHelper)
        PARSE_SPHERE_FLAG("parametric", g_sphere.flags.showParametric)
        PARSE_SHADING_MODE("color", SHADING_COLOR)
        PARSE_SHADING_MODE("cmap" , SHADING_COLORMAP)
        PARSE_SHADING_MODE("brdf" , SHADING_BRDF)
        PARSE_SAMPLING_SCHEME("ggx", SCHEME_GGX)
        PARSE_SAMPLING_SCHEME("merl", SCHEME_MERL)
    }

    glfwInit();
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 5);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GL_TRUE);
    glfwWindowHint(GLFW_VISIBLE, startVisible);

    // Create the Window
    LOG("Loading {Window-Main}\n");
    GLFWwindow* window = glfwCreateWindow(
                             VIEWER_DEFAULT_WIDTH,
                             VIEWER_DEFAULT_HEIGHT,
                             "Hello MERL", NULL, NULL
                             );
    if (window == NULL) {
        LOG("=> Failure <=\n");
        glfwTerminate();
        return -1;
    }
    glfwMakeContextCurrent(window);
    glfwSetKeyCallback(window, &keyboardCallback);
    glfwSetCursorPosCallback(window, &mouseMotionCallback);
    glfwSetMouseButtonCallback(window, &mouseButtonCallback);
    glfwSetScrollCallback(window, &mouseScrollCallback);

    // Load OpenGL functions
    LOG("Loading {OpenGL}\n");
    if (!gladLoadGLLoader((GLADloadproc)glfwGetProcAddress)) {
        LOG("gladLoadGLLoader failed\n");
        return -1;
    }
    log_debug_output();

    LOG("-- Begin -- Demo\n");
    try {
        //log_debug_output();
        ImGui::CreateContext();
        ImGui_ImplGlfwGL3_Init(window, false);
        ImGui::StyleColorsDark();
        init();

        while (!glfwWindowShouldClose(window) && (uint32_t)g_app.frame < (uint32_t)g_app.frameLimit) {
            glfwPollEvents();

            render();
            ++g_app.frame;

            glfwSwapBuffers(window);
        }

        release();
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
    } catch (std::exception& e) {
        LOG("%s", e.what());
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
        LOG("(!) Demo Killed (!)\n");

        return EXIT_FAILURE;
    } catch (...) {
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
        LOG("(!) Demo Killed (!)\n");

        return EXIT_FAILURE;
    }
    LOG("-- End -- Demo\n");


    return 0;
}